

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcColourSpecification::IfcColourSpecification
          (IfcColourSpecification *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>)
                    ._vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[2];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).
  _vptr_ObjectHelper = pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>)
                    ._vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcColourSpecification,_1UL>).field_0x20 = 0;
  this->field_0x30 = 0;
  return;
}

Assistant:

ObjectHelper()
        : aux_is_derived(0) {
            // empty
        }